

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O2

int Prs_ManFindType(char *pName,int *pInputs,int fOut,char ***ppNames)

{
  int iVar1;
  char *__s;
  long lVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  
  *pInputs = -1;
  lVar2 = 0;
  do {
    lVar5 = lVar2;
    if (lVar5 + 0x40 == 0x1480) {
      return 3;
    }
    __s = *(char **)((long)s_VerInfo[1].pSigNames + lVar5 + -8);
    sVar4 = strlen(__s);
    iVar3 = strncmp(pName,__s,(long)(int)sVar4);
    lVar2 = lVar5 + 0x40;
  } while (iVar3 != 0);
  iVar3 = *(int *)((long)s_VerInfo[1].pSigNames + lVar5 + -0x10);
  iVar1 = *(int *)((long)s_VerInfo[1].pSigNames + lVar5 + -0xc);
  *pInputs = iVar1;
  if (fOut == 0) {
    iVar1 = 0;
  }
  *ppNames = (char **)((long)s_VerInfo[1].pSigNames + (long)iVar1 * 8 + lVar5);
  return iVar3;
}

Assistant:

static inline int Prs_ManFindType( char * pName, int * pInputs, int fOut, char *** ppNames )
{
    int i, Length;
    *pInputs = -1;
    for ( i = 1; s_VerInfo[i].pTypeName; i++ )
    {
        Length = strlen(s_VerInfo[i].pTypeName);
        if ( !strncmp(pName, s_VerInfo[i].pTypeName, Length) )
        {
            *pInputs = s_VerInfo[i].nInputs;
            *ppNames = (char **)s_VerInfo[i].pSigNames + (fOut ? s_VerInfo[i].nInputs : 0);
            return s_VerInfo[i].Type;
        }
    }
    return CBA_OBJ_BOX;
}